

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O1

Blob * jbcoin::serialize_ec_point(Blob *__return_storage_ptr__,ec_point *point)

{
  uint8_t *ptr;
  value_type_conflict1 *__val;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptr = (uint8_t *)operator_new(0x21);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = ptr;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = ptr;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = ptr + 0x21;
  ptr[0] = '\0';
  ptr[1] = '\0';
  ptr[2] = '\0';
  ptr[3] = '\0';
  ptr[4] = '\0';
  ptr[5] = '\0';
  ptr[6] = '\0';
  ptr[7] = '\0';
  ptr[8] = '\0';
  ptr[9] = '\0';
  ptr[10] = '\0';
  ptr[0xb] = '\0';
  ptr[0xc] = '\0';
  ptr[0xd] = '\0';
  ptr[0xe] = '\0';
  ptr[0xf] = '\0';
  ptr[0x10] = '\0';
  ptr[0x11] = '\0';
  ptr[0x12] = '\0';
  ptr[0x13] = '\0';
  ptr[0x14] = '\0';
  ptr[0x15] = '\0';
  ptr[0x16] = '\0';
  ptr[0x17] = '\0';
  ptr[0x18] = '\0';
  ptr[0x19] = '\0';
  ptr[0x1a] = '\0';
  ptr[0x1b] = '\0';
  ptr[0x1c] = '\0';
  ptr[0x1d] = '\0';
  ptr[0x1e] = '\0';
  ptr[0x1f] = '\0';
  ptr[0x20] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = ptr + 0x21;
  openssl::serialize_ec_point(point,ptr);
  return __return_storage_ptr__;
}

Assistant:

static Blob serialize_ec_point (ec_point const& point)
{
    Blob result (33);

    serialize_ec_point (point, &result[0]);

    return result;
}